

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classification.hpp
# Opt level: O0

void __thiscall
boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
          (is_any_ofF<char> *this,iterator_range<const_char_*> *Range)

{
  bool bVar1;
  type tVar2;
  void *pvVar3;
  type __result;
  char *in_RDI;
  set_value_type *Storage;
  size_t Size;
  iterator_range<const_char_*> *in_stack_ffffffffffffffd0;
  char *__first;
  
  in_RDI[0x10] = '\0';
  in_RDI[0x11] = '\0';
  in_RDI[0x12] = '\0';
  in_RDI[0x13] = '\0';
  in_RDI[0x14] = '\0';
  in_RDI[0x15] = '\0';
  in_RDI[0x16] = '\0';
  in_RDI[0x17] = '\0';
  in_RDI[0] = '\0';
  in_RDI[1] = '\0';
  in_RDI[2] = '\0';
  in_RDI[3] = '\0';
  in_RDI[4] = '\0';
  in_RDI[5] = '\0';
  in_RDI[6] = '\0';
  in_RDI[7] = '\0';
  tVar2 = distance<boost::iterator_range<char_const*>>(in_stack_ffffffffffffffd0);
  *(type *)(in_RDI + 0x10) = tVar2;
  bVar1 = use_fixed_storage(*(size_t *)(in_RDI + 0x10));
  __first = in_RDI;
  if (!bVar1) {
    pvVar3 = operator_new__(*(ulong *)(in_RDI + 0x10));
    *(void **)in_RDI = pvVar3;
    __first = *(char **)in_RDI;
  }
  __result = range_adl_barrier::begin<boost::iterator_range<char_const*>>
                       ((iterator_range<const_char_*> *)0x206ed6);
  range_adl_barrier::end<boost::iterator_range<char_const*>>
            ((iterator_range<const_char_*> *)0x206ee5);
  std::copy<char_const*,char*>(__first,in_RDI,__result);
  std::sort<char*>(__first,in_RDI);
  return;
}

Assistant:

is_any_ofF( const RangeT& Range ) : m_Size(0)
                {
                    // Prepare storage
                    m_Storage.m_dynSet=0;

                    std::size_t Size=::boost::distance(Range);
                    m_Size=Size;
                    set_value_type* Storage=0;

                    if(use_fixed_storage(m_Size))
                    {
                        // Use fixed storage
                        Storage=&m_Storage.m_fixSet[0];
                    }
                    else
                    {
                        // Use dynamic storage
                        m_Storage.m_dynSet=new set_value_type[m_Size];
                        Storage=m_Storage.m_dynSet;
                    }

                    // Use fixed storage
                    ::std::copy(::boost::begin(Range), ::boost::end(Range), Storage);
                    ::std::sort(Storage, Storage+m_Size);
                }